

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void R_DrawSpanTranslucentP_C(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE *pBVar4;
  DWORD *pDVar5;
  DWORD *pDVar6;
  lighttable_t *plVar7;
  dsfixed_t dVar8;
  dsfixed_t dVar9;
  BYTE *pBVar10;
  int iVar11;
  long lVar12;
  dsfixed_t dVar13;
  dsfixed_t dVar14;
  uint uVar15;
  int iVar16;
  
  pBVar10 = ds_source;
  dVar9 = ds_ystep;
  dVar8 = ds_xstep;
  plVar7 = ds_colormap;
  pDVar6 = dc_destblend;
  pDVar5 = dc_srcblend;
  pBVar4 = dc_destorg;
  iVar11 = ylookup[ds_y] + ds_x1;
  iVar16 = (ds_x2 - ds_x1) + 1;
  if (ds_ybits == 6 && ds_xbits == 6) {
    lVar12 = 0;
    dVar13 = ds_xfrac;
    dVar14 = ds_yfrac;
    do {
      uVar15 = pDVar6[pBVar4[lVar12 + iVar11]] +
               pDVar5[plVar7[pBVar10[dVar14 >> 0x1a | dVar13 >> 0x14 & 0xffffffc0]]] | 0x1f07c1f;
      pBVar4[lVar12 + iVar11] = RGB32k.All[uVar15 >> 0xf & uVar15];
      dVar13 = dVar13 + dVar8;
      dVar14 = dVar14 + dVar9;
      lVar12 = lVar12 + 1;
    } while (iVar16 != (int)lVar12);
  }
  else {
    bVar3 = (byte)ds_ybits;
    bVar1 = 0x20 - bVar3;
    bVar2 = (byte)ds_xbits;
    lVar12 = 0;
    dVar13 = ds_xfrac;
    dVar14 = ds_yfrac;
    do {
      uVar15 = pDVar6[pBVar4[lVar12 + iVar11]] +
               pDVar5[plVar7[pBVar10[(int)((dVar14 >> (bVar1 & 0x1f)) +
                                          (dVar13 >> (bVar1 - bVar2 & 0x1f) &
                                          ~(-1 << (bVar2 & 0x1f)) << (bVar3 & 0x1f)))]]] | 0x1f07c1f
      ;
      pBVar4[lVar12 + iVar11] = RGB32k.All[uVar15 >> 0xf & uVar15];
      dVar13 = dVar13 + dVar8;
      dVar14 = dVar14 + dVar9;
      lVar12 = lVar12 + 1;
    } while (iVar16 != (int)lVar12);
  }
  return;
}

Assistant:

void R_DrawSpanTranslucentP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;
	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));
			DWORD fg = colormap[source[spot]];
			DWORD bg = *dest;
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[fg & (fg>>15)];
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;
		do
		{
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
			DWORD fg = colormap[source[spot]];
			DWORD bg = *dest;
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[fg & (fg>>15)];
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}